

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O2

int RDL_pathsShareOnlyStart(uint r,uint y,uint z,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint *puVar1;
  ulong uVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)z;
  uVar6 = (ulong)y;
  uVar2 = (ulong)r;
  uVar7 = (ulong)gra->V;
  __ptr = malloc(uVar7 * 4);
  __ptr_00 = malloc(uVar7 * 4);
  for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined4 *)((long)__ptr + uVar3 * 4) = 0;
    *(undefined4 *)((long)__ptr_00 + uVar3 * 4) = 0;
  }
  *(undefined4 *)((long)__ptr + uVar6 * 4) = 1;
  *(undefined4 *)((long)__ptr_00 + uVar8 * 4) = 1;
  puVar1 = spi->pred[uVar2];
  do {
    uVar4 = puVar1[uVar6];
    uVar6 = (ulong)uVar4;
    *(undefined4 *)((long)__ptr + uVar6 * 4) = 1;
  } while (uVar4 != r);
  do {
    uVar4 = puVar1[uVar8];
    uVar8 = (ulong)uVar4;
    *(undefined4 *)((long)__ptr_00 + uVar8 * 4) = 1;
  } while (uVar4 != r);
  uVar3 = 0;
  uVar4 = 0;
  while ((uVar3 < uVar7 && (uVar4 < 2))) {
    if (*(int *)((long)__ptr + uVar3 * 4) == 1) {
      uVar4 = uVar4 + (*(int *)((long)__ptr_00 + uVar3 * 4) == 1);
    }
    uVar3 = uVar3 + 1;
  }
  uVar5 = 0;
  if ((uVar4 == 1) && (*(int *)((long)__ptr + uVar2 * 4) == 1)) {
    uVar5 = (uint)(*(int *)((long)__ptr_00 + uVar2 * 4) == 1);
  }
  free(__ptr);
  free(__ptr_00);
  return uVar5;
}

Assistant:

static int RDL_pathsShareOnlyStart(unsigned r, unsigned y, unsigned z, RDL_graph *gra, RDL_sPathInfo *spi)
{
  unsigned result = 0, i, pnt, count=0;
  unsigned *vertInRY, *vertInRZ; /*edges in P(r,y) and P(r,z)*/
  vertInRY = malloc(gra->V * sizeof(*vertInRY));
  vertInRZ = malloc(gra->V * sizeof(*vertInRZ));

  for(i=0; i<gra->V; ++i)
  {
    vertInRY[i] = 0;
    vertInRZ[i] = 0;
  }
  vertInRY[y] = 1;
  vertInRZ[z] = 1;
  /*find out which vertices are on the path P(r,y)*/
  pnt = y;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRY[pnt] = 1;
  }while(pnt != r);
  /*find out which vertices are on the path P(r,z)*/
  pnt = z;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRZ[pnt] = 1;
  }while(pnt != r);
  /*find out if more than one vertex is shared by the paths*/
  for(i=0; i<gra->V && count<2; ++i)
  {
    if(vertInRY[i] == 1 && vertInRZ[i] == 1)
    {
      ++count;
    }
  }
  /*if r is the only shared vertex of the two paths return 1*/
  if(count == 1 && (vertInRY[r] == 1) && (vertInRZ[r] == 1))
  {
    result = 1;
  }

  free(vertInRY);
  free(vertInRZ);
  return result;
}